

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

string * __thiscall
t_rs_generator::rust_struct_name_abi_cxx11_
          (string *__return_storage_ptr__,t_rs_generator *this,t_struct *tstruct)

{
  int iVar1;
  undefined4 extraout_var;
  string base_struct_name;
  string sStack_38;
  
  iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  rust_camel_case(&sStack_38,this,(string *)CONCAT44(extraout_var,iVar1));
  rust_safe_name(__return_storage_ptr__,this,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::rust_struct_name(t_struct* tstruct) {
  string base_struct_name(rust_camel_case(tstruct->get_name()));
  return rust_safe_name(base_struct_name);
}